

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

void __thiscall IMLE::Param::display(Param *this,ostream *out)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"d= ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->d);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"D= ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->D);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"alpha= ");
  poVar1 = std::ostream::_M_insert<double>(this->alpha);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Psi0= ");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                    &this->Psi0);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"sigma0= ");
  poVar1 = std::ostream::_M_insert<double>(this->sigma0);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"wsigma= ");
  poVar1 = std::ostream::_M_insert<double>(this->wsigma);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"wSigma= ");
  poVar1 = std::ostream::_M_insert<double>(this->wSigma);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"wNu= ");
  poVar1 = std::ostream::_M_insert<double>(this->wNu);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"wLambda= ");
  poVar1 = std::ostream::_M_insert<double>(this->wLambda);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"wpsi= ");
  poVar1 = std::ostream::_M_insert<double>(this->wpsi);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"wPsi= ");
  poVar1 = std::ostream::_M_insert<double>(this->wPsi);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"p0= ");
  poVar1 = std::ostream::_M_insert<double>(this->p0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"nOutliers= ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->nOutliers);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(out,"multiValuedSignificance= ");
  poVar1 = std::ostream::_M_insert<double>(this->multiValuedSignificance);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"nSolMin= ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->nSolMin);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"nSolMax= ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->nSolMax);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"iterMax= ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->iterMax);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"defaultSave= ");
  poVar1 = std::operator<<(poVar1,(string *)&this->defaultSave);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"saveOnExit= ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"accelerated= ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(out);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::Param::display(std::ostream &out) const
{
    out << EXPAND(d) << std::endl;
    out << EXPAND(D) << std::endl;

    out << EXPAND(alpha) << std::endl;

    out << EXPAND(Psi0) << std::endl;
    out << EXPAND(sigma0) << std::endl;

    out << EXPAND(wsigma) << std::endl;
    out << EXPAND(wSigma) << std::endl;
    out << EXPAND(wNu) << std::endl;
    out << EXPAND(wLambda) << std::endl;
    out << EXPAND(wpsi) << std::endl;
    out << EXPAND(wPsi) << std::endl;

    out << EXPAND(p0) << std::endl;
    out << EXPAND(nOutliers) << std::endl;

    out << EXPAND(multiValuedSignificance) << std::endl;
    out << EXPAND(nSolMin) << std::endl;
    out << EXPAND(nSolMax) << std::endl;
    out << EXPAND(iterMax) << std::endl;

    out << EXPAND(defaultSave) << std::endl;
    out << EXPAND(saveOnExit) << std::endl;
    out << EXPAND(accelerated) << std::endl;

    out << std::endl << std::endl;
}